

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void slang::ast::getNetRanges
               (Expression *expr,SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *ranges)

{
  bitwidth_t *pbVar1;
  ExpressionKind EVar2;
  _Optional_payload_base<slang::ast::BinaryOperator> _Var3;
  TimingControl *pTVar4;
  NetType *pNVar5;
  size_type sVar6;
  bool bVar7;
  Symbol *pSVar8;
  long lVar9;
  ConversionExpression *conv;
  NetTypeRange local_38;
  
  do {
    pSVar8 = Expression::getSymbolReference(expr,true);
    if ((pSVar8 != (Symbol *)0x0) && (pSVar8->kind == Net)) {
      pNVar5 = (NetType *)pSVar8[5].name._M_str;
      local_38.width =
           Type::getBitWidth((((AssignmentExpression *)expr)->super_Expression).type.ptr);
      sVar6 = ranges->len;
      if ((sVar6 != 0) && (ranges->data_[sVar6 - 1].netType == pNVar5)) {
        pbVar1 = &ranges->data_[sVar6 - 1].width;
        *pbVar1 = *pbVar1 + local_38.width;
        return;
      }
      local_38.netType = pNVar5;
      SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
      emplace_back<slang::ast::PortSymbol::NetTypeRange>(ranges,&local_38);
      return;
    }
    EVar2 = (((AssignmentExpression *)expr)->super_Expression).kind;
    if (EVar2 == Assignment) {
      bVar7 = AssignmentExpression::isLValueArg((AssignmentExpression *)expr);
      lVar9 = 0x40;
      if (!bVar7) {
        return;
      }
    }
    else {
      if (EVar2 != Conversion) {
        if (EVar2 != Concatenation) {
          return;
        }
        _Var3 = (((AssignmentExpression *)expr)->op).
                super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::BinaryOperator>;
        pTVar4 = ((AssignmentExpression *)expr)->timingControl;
        for (lVar9 = 0; (long)pTVar4 << 3 != lVar9; lVar9 = lVar9 + 8) {
          getNetRanges(*(Expression **)((long)_Var3 + lVar9),ranges);
        }
        return;
      }
      lVar9 = 0x38;
      if (1 < (int)(((AssignmentExpression *)expr)->op).
                   super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value) {
        return;
      }
    }
    expr = *(Expression **)((long)&(((AssignmentExpression *)expr)->super_Expression).kind + lVar9);
  } while( true );
}

Assistant:

static void getNetRanges(const Expression& expr,
                         SmallVectorBase<PortSymbol::NetTypeRange>& ranges) {
    if (auto sym = expr.getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& nt = sym->as<NetSymbol>().netType;
        bitwidth_t width = expr.type->getBitWidth();

        if (!ranges.empty() && ranges.back().netType == &nt)
            ranges.back().width += width;
        else
            ranges.push_back({&nt, width});
    }
    else if (expr.kind == ExpressionKind::Concatenation) {
        for (auto op : expr.as<ConcatenationExpression>().operands())
            getNetRanges(*op, ranges);
    }
    else if (expr.kind == ExpressionKind::Conversion) {
        auto& conv = expr.as<ConversionExpression>();
        if (conv.isImplicit())
            getNetRanges(conv.operand(), ranges);
    }
    else if (expr.kind == ExpressionKind::Assignment) {
        auto& assign = expr.as<AssignmentExpression>();
        if (assign.isLValueArg())
            getNetRanges(assign.left(), ranges);
    }
}